

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void deflate(nghttp2_hd_deflater *deflater,nghttp2_hd_inflater *inflater,nghttp2_nv *nva,
            size_t nvlen)

{
  FILE *__stream;
  int iVar1;
  size_t __size;
  void *__ptr;
  ulong uVar2;
  undefined8 uVar3;
  uint8_t *in_RCX;
  nghttp2_hd_inflater *in_RDX;
  undefined8 in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t sum;
  size_t i;
  size_t outlen;
  size_t buflen;
  uint8_t *buf;
  nghttp2_ssize rv;
  double local_68;
  long local_50;
  uint8_t *local_48;
  ulong inlen;
  
  local_50 = 0;
  for (local_48 = (uint8_t *)0x0; local_48 < in_RCX; local_48 = local_48 + 1) {
    local_50 = *(long *)(in_RDX + (long)local_48 * 0x28 + 0x10) +
               *(long *)(in_RDX + (long)local_48 * 0x28 + 0x18) + local_50;
  }
  printf("Input (%zu byte(s)):\n\n",local_50);
  for (local_48 = (uint8_t *)0x0; local_48 < in_RCX; local_48 = local_48 + 1) {
    fwrite(*(void **)(in_RDX + (long)local_48 * 0x28),1,
           *(size_t *)(in_RDX + (long)local_48 * 0x28 + 0x10),_stdout);
    printf(": ");
    fwrite(*(void **)(in_RDX + (long)local_48 * 0x28 + 8),1,
           *(size_t *)(in_RDX + (long)local_48 * 0x28 + 0x18),_stdout);
    printf("\n");
  }
  __size = nghttp2_hd_deflate_bound(in_RDI,in_RDX,in_RCX);
  __ptr = malloc(__size);
  uVar2 = nghttp2_hd_deflate_hd2(in_RDI,__ptr,__size,in_RDX,in_RCX);
  __stream = _stderr;
  if ((long)uVar2 < 0) {
    uVar3 = nghttp2_strerror(uVar2 & 0xffffffff);
    fprintf(__stream,"nghttp2_hd_deflate_hd2() failed with error: %s\n",uVar3);
    free(__ptr);
    exit(1);
  }
  if (local_50 == 0) {
    local_68 = 0.0;
  }
  else {
    auVar4._8_4_ = (int)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    auVar5._8_4_ = (int)((ulong)local_50 >> 0x20);
    auVar5._0_8_ = local_50;
    auVar5._12_4_ = 0x45300000;
    local_68 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0));
  }
  inlen = uVar2;
  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n",local_68,uVar2);
  for (local_48 = (uint8_t *)0x0; local_48 < uVar2; local_48 = (uint8_t *)((long)local_48 + 1)) {
    if (((ulong)local_48 & 0xf) == 0) {
      printf("%08zX: ",local_48);
    }
    printf("%02X ",(ulong)*(byte *)((long)__ptr + (long)local_48));
    if (((long)local_48 + 1U & 0xf) == 0) {
      printf("\n");
    }
  }
  printf("\n\nInflate:\n\n");
  iVar1 = inflate_header_block(in_RDX,in_RCX,inlen,(int)((ulong)__ptr >> 0x20));
  if (iVar1 != 0) {
    free(__ptr);
    exit(1);
  }
  printf("\n-------------------------------------------------------------------------------\n");
  free(__ptr);
  return;
}

Assistant:

static void deflate(nghttp2_hd_deflater *deflater,
                    nghttp2_hd_inflater *inflater, const nghttp2_nv *const nva,
                    size_t nvlen) {
  nghttp2_ssize rv;
  uint8_t *buf;
  size_t buflen;
  size_t outlen;
  size_t i;
  size_t sum;

  sum = 0;

  for (i = 0; i < nvlen; ++i) {
    sum += nva[i].namelen + nva[i].valuelen;
  }

  printf("Input (%zu byte(s)):\n\n", sum);

  for (i = 0; i < nvlen; ++i) {
    fwrite(nva[i].name, 1, nva[i].namelen, stdout);
    printf(": ");
    fwrite(nva[i].value, 1, nva[i].valuelen, stdout);
    printf("\n");
  }

  buflen = nghttp2_hd_deflate_bound(deflater, nva, nvlen);
  buf = malloc(buflen);

  rv = nghttp2_hd_deflate_hd2(deflater, buf, buflen, nva, nvlen);

  if (rv < 0) {
    fprintf(stderr, "nghttp2_hd_deflate_hd2() failed with error: %s\n",
            nghttp2_strerror((int)rv));

    free(buf);

    exit(EXIT_FAILURE);
  }

  outlen = (size_t)rv;

  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n", outlen,
         sum == 0 ? 0 : (double)outlen / (double)sum);

  for (i = 0; i < outlen; ++i) {
    if ((i & 0x0fu) == 0) {
      printf("%08zX: ", i);
    }

    printf("%02X ", buf[i]);

    if (((i + 1) & 0x0fu) == 0) {
      printf("\n");
    }
  }

  printf("\n\nInflate:\n\n");

  /* We pass 1 to final parameter, because buf contains whole deflated
     header data. */
  rv = inflate_header_block(inflater, buf, outlen, 1);

  if (rv != 0) {
    free(buf);

    exit(EXIT_FAILURE);
  }

  printf("\n-----------------------------------------------------------"
         "--------------------\n");

  free(buf);
}